

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestPipe::~TestPipe(TestPipe *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_BufferedInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__TestPipe_00378cd0;
  (this->super_OutputStream)._vptr_OutputStream = (_func_int **)&PTR__TestPipe_00378d10;
  pcVar2 = (this->data)._M_dataplus._M_p;
  paVar1 = &(this->data).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  kj::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&this->super_OutputStream);
  kj::BufferedInputStream::~BufferedInputStream(&this->super_BufferedInputStream);
  return;
}

Assistant:

~TestPipe() {}